

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.cpp
# Opt level: O0

double __thiscall pfederc::Logger::log(Logger *this,double __x)

{
  uint uVar1;
  socklen_t *in_RCX;
  string *in_RDX;
  ushort in_SI;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double dVar2;
  string *msg_local;
  Level logLevel_local;
  Logger *this_local;
  
  uVar1 = accept(this,(uint)in_SI,(sockaddr *)in_RDX,in_RCX);
  dVar2 = extraout_XMM0_Qa;
  if ((uVar1 & 1) != 0) {
    if ((in_SI & 0xd) == 0) {
      BaseLogger::error(&this->baseLog,in_RDX);
      dVar2 = extraout_XMM0_Qa_01;
    }
    else {
      BaseLogger::info(&this->baseLog,in_RDX);
      dVar2 = extraout_XMM0_Qa_00;
    }
  }
  return dVar2;
}

Assistant:

bool Logger::log(Level logLevel, const std::string &msg) noexcept {
  if (!accept(logLevel))
    return false;

  if ((logLevel & (LVL_WARNING | LVL_NOTE | LVL_HELP)) != 0)
    baseLog.info(msg);
  else
    baseLog.error(msg);

  return true;
}